

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O3

int gz_next4(xz_statep state,unsigned_long *ret)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  uInt uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = (state->zstrm).avail_in;
  pbVar3 = (state->zstrm).next_in;
  if (uVar5 == 0) {
    (state->strm).avail_in = 0;
    (state->strm).next_in = pbVar3;
    iVar1 = xz_avail(state);
    uVar5 = (uInt)(state->strm).avail_in;
    (state->zstrm).avail_in = uVar5;
    pbVar4 = (state->strm).next_in;
    (state->zstrm).next_in = pbVar4;
    if (iVar1 == -1) {
      uVar7 = 0xffffffffffffffff;
      goto LAB_001e5013;
    }
    pbVar3 = pbVar4;
    if (uVar5 != 0) goto LAB_001e4ff8;
    uVar7 = 0xffffffffffffffff;
LAB_001e505d:
    lVar6 = 0xffffff00;
    (state->strm).avail_in = 0;
    (state->strm).next_in = pbVar4;
    iVar1 = xz_avail(state);
    uVar5 = (uInt)(state->strm).avail_in;
    (state->zstrm).avail_in = uVar5;
    pbVar3 = (state->strm).next_in;
    (state->zstrm).next_in = pbVar3;
    if (iVar1 == -1) goto LAB_001e50bb;
    pbVar4 = pbVar3;
    if (uVar5 != 0) goto LAB_001e509c;
    lVar6 = uVar7 + 0xffffff00;
LAB_001e50d3:
    (state->strm).avail_in = 0;
    (state->strm).next_in = pbVar3;
    iVar1 = xz_avail(state);
    uVar5 = (uInt)(state->strm).avail_in;
    (state->zstrm).avail_in = uVar5;
    pbVar4 = (state->strm).next_in;
    (state->zstrm).next_in = pbVar4;
    if (iVar1 == -1) {
      lVar2 = -0x10000;
      goto LAB_001e5129;
    }
    pbVar3 = pbVar4;
    if (uVar5 != 0) goto LAB_001e510c;
    lVar6 = lVar6 + -0x10000;
  }
  else {
LAB_001e4ff8:
    uVar5 = uVar5 - 1;
    (state->zstrm).avail_in = uVar5;
    pbVar4 = pbVar3 + 1;
    (state->zstrm).next_in = pbVar4;
    uVar7 = (ulong)*pbVar3;
LAB_001e5013:
    if (uVar5 == 0) goto LAB_001e505d;
LAB_001e509c:
    uVar5 = uVar5 - 1;
    (state->zstrm).avail_in = uVar5;
    pbVar3 = pbVar4 + 1;
    (state->zstrm).next_in = pbVar3;
    lVar6 = (ulong)*pbVar4 << 8;
LAB_001e50bb:
    lVar6 = uVar7 + lVar6;
    if (uVar5 == 0) goto LAB_001e50d3;
LAB_001e510c:
    uVar5 = uVar5 - 1;
    (state->zstrm).avail_in = uVar5;
    pbVar4 = pbVar3 + 1;
    (state->zstrm).next_in = pbVar4;
    lVar2 = (ulong)*pbVar3 << 0x10;
LAB_001e5129:
    lVar6 = lVar6 + lVar2;
    if (uVar5 != 0) goto LAB_001e5188;
  }
  (state->strm).avail_in = 0;
  (state->strm).next_in = pbVar4;
  iVar1 = xz_avail(state);
  pbVar4 = (state->strm).next_in;
  uVar5 = (uInt)(state->strm).avail_in;
  (state->zstrm).avail_in = uVar5;
  (state->zstrm).next_in = pbVar4;
  if (uVar5 == 0 || iVar1 == -1) {
    return -1;
  }
LAB_001e5188:
  (state->zstrm).avail_in = uVar5 - 1;
  (state->zstrm).next_in = pbVar4 + 1;
  *ret = (ulong)*pbVar4 * 0x1000000 + lVar6;
  return 0;
}

Assistant:

static int
gz_next4(xz_statep state, unsigned long *ret)
{
    int ch;
    unsigned long val;
    z_streamp strm = &(state->zstrm);

    val = NEXTZ();
    val += (unsigned) NEXTZ() << 8;
    val += (unsigned long) NEXTZ() << 16;
    ch = NEXTZ();
    if (ch == -1)
        return -1;
    val += (unsigned long) ch << 24;
    *ret = val;
    return 0;
}